

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algebra.h
# Opt level: O0

void Gs::Normalize<Gs::QuaternionT<float>,float>
               (QuaternionT<float> *outVec,QuaternionT<float> *inVec)

{
  float fVar1;
  double dVar2;
  undefined8 local_2c;
  undefined8 local_24;
  float local_1c;
  QuaternionT<float> *pQStack_18;
  float len;
  QuaternionT<float> *inVec_local;
  QuaternionT<float> *outVec_local;
  
  pQStack_18 = inVec;
  inVec_local = outVec;
  local_1c = LengthSq<Gs::QuaternionT<float>,float>(inVec);
  if (((local_1c == 0.0) && (!NAN(local_1c))) || ((local_1c == 1.0 && (!NAN(local_1c))))) {
    fVar1 = pQStack_18->y;
    inVec_local->x = pQStack_18->x;
    inVec_local->y = fVar1;
    fVar1 = pQStack_18->w;
    inVec_local->z = pQStack_18->z;
    inVec_local->w = fVar1;
  }
  else {
    dVar2 = std::sqrt((double)(ulong)(uint)local_1c);
    local_1c = 1.0 / SUB84(dVar2,0);
    operator*((Gs *)&local_2c,pQStack_18,&local_1c);
    inVec_local->x = (float)(undefined4)local_2c;
    inVec_local->y = (float)local_2c._4_4_;
    inVec_local->z = (float)(undefined4)local_24;
    inVec_local->w = (float)local_24._4_4_;
  }
  return;
}

Assistant:

void Normalize(TVector& outVec, const TVector& inVec)
{
    TScalar len = LengthSq<TVector, TScalar>(inVec);
    if (len != TScalar(0) && len != TScalar(1))
    {
        len = TScalar(1) / std::sqrt(len);
        outVec = inVec * len;
    }
    else
        outVec = inVec;
}